

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise1D::load_model(DeconvolutionDepthWise1D *this,ModelBin *mb)

{
  int *piVar1;
  Allocator *pAVar2;
  int iVar3;
  void *local_70;
  int *local_68;
  size_t local_60;
  int local_58;
  Allocator *local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  size_t local_30;
  
  (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
  if (&this->weight_data != (Mat *)&local_70) {
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + 1;
      UNLOCK();
    }
    piVar1 = (this->weight_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pAVar2 = (this->weight_data).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->weight_data).data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_data).data = local_70;
    (this->weight_data).refcount = local_68;
    (this->weight_data).elemsize = local_60;
    (this->weight_data).elempack = local_58;
    (this->weight_data).allocator = local_50;
    (this->weight_data).dims = local_48;
    (this->weight_data).w = iStack_44;
    (this->weight_data).h = iStack_40;
    (this->weight_data).d = iStack_3c;
    (this->weight_data).c = local_38;
    (this->weight_data).cstep = local_30;
  }
  if (local_68 != (int *)0x0) {
    LOCK();
    *local_68 = *local_68 + -1;
    UNLOCK();
    if (*local_68 == 0) {
      if (local_50 == (Allocator *)0x0) {
        free(local_70);
      }
      else {
        (*local_50->_vptr_Allocator[3])();
      }
    }
  }
  iVar3 = -100;
  if (((this->weight_data).data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->num_output,1);
      if (&this->bias_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar1 = (this->bias_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->bias_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->bias_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->bias_data).data = local_70;
        (this->bias_data).refcount = local_68;
        (this->bias_data).elemsize = local_60;
        (this->bias_data).elempack = local_58;
        (this->bias_data).allocator = local_50;
        (this->bias_data).dims = local_48;
        (this->bias_data).w = iStack_44;
        (this->bias_data).h = iStack_40;
        (this->bias_data).d = iStack_3c;
        (this->bias_data).c = local_38;
        (this->bias_data).cstep = local_30;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) {
            free(local_70);
          }
          else {
            (*local_50->_vptr_Allocator[3])();
          }
        }
      }
      if ((this->bias_data).data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int DeconvolutionDepthWise1D::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}